

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderAdjacencyTests::createGridLineStrip
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  uint uVar1;
  GLuint GVar2;
  AdjacencyGrid *pAVar3;
  AdjacencyGridPoint *__s;
  long lVar4;
  AdjacencyGridPoint **ppAVar5;
  GLfloat *pGVar6;
  ulong uVar7;
  
  pAVar3 = test_data->m_grid;
  GVar2 = pAVar3->m_n_points;
  uVar1 = GVar2 + 2;
  (pAVar3->m_line_strip).m_n_points = uVar1;
  uVar7 = (ulong)uVar1 * 0xc;
  __s = (AdjacencyGridPoint *)operator_new__(uVar7);
  (pAVar3->m_line_strip).m_points = __s;
  memset(__s,0,uVar7);
  pGVar6 = &__s->x;
  lVar4 = -0x10;
  for (uVar7 = 0; uVar7 < uVar1; uVar7 = uVar7 + 1) {
    ((AdjacencyGridPoint *)(pGVar6 + -1))->index = (GLuint)uVar7;
    if (uVar7 == 0) {
      ppAVar5 = &pAVar3->m_line_segments->m_point_start_adjacent;
    }
    else if (GVar2 + 1 == uVar7) {
      ppAVar5 = &pAVar3->m_line_segments[pAVar3->m_n_segments - 1].m_point_end_adjacent;
    }
    else {
      ppAVar5 = (AdjacencyGridPoint **)((long)&pAVar3->m_line_segments->m_point_end + lVar4);
    }
    *(undefined8 *)pGVar6 = *(undefined8 *)&(*ppAVar5)->x;
    lVar4 = lVar4 + 0x20;
    pGVar6 = pGVar6 + 3;
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::createGridLineStrip(AdjacencyTestData& test_data)
{
	/* Add 2 extra point for adjacency start+end points */
	test_data.m_grid->m_line_strip.m_n_points = test_data.m_grid->m_n_points + 2;
	test_data.m_grid->m_line_strip.m_points   = new AdjacencyGridPoint[test_data.m_grid->m_line_strip.m_n_points];

	memset(test_data.m_grid->m_line_strip.m_points, 0,
		   sizeof(AdjacencyGridPoint) * test_data.m_grid->m_line_strip.m_n_points);

	for (unsigned int n = 0; n < test_data.m_grid->m_line_strip.m_n_points; ++n)
	{
		AdjacencyGridPoint* pointPtr = test_data.m_grid->m_line_strip.m_points + n;

		pointPtr->index = n;

		/* If this is a start point, use any of the adjacent points */
		if (n == 0)
		{
			pointPtr->x = test_data.m_grid->m_line_segments[0].m_point_start_adjacent->x;
			pointPtr->y = test_data.m_grid->m_line_segments[0].m_point_start_adjacent->y;
		}
		else
			/* Last point should be handled analogously */
			if (n == (test_data.m_grid->m_line_strip.m_n_points - 1))
		{
			pointPtr->x = test_data.m_grid->m_line_segments[test_data.m_grid->m_n_segments - 1].m_point_end_adjacent->x;
			pointPtr->y = test_data.m_grid->m_line_segments[test_data.m_grid->m_n_segments - 1].m_point_end_adjacent->y;
		}
		else
		/* Intermediate points */
		{
			pointPtr->x = test_data.m_grid->m_line_segments[n - 1].m_point_start->x;
			pointPtr->y = test_data.m_grid->m_line_segments[n - 1].m_point_start->y;
		}
	} /* for (all points) */
}